

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidatePushElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *qname)

{
  uint uVar1;
  xmlElementPtr pxVar2;
  _xmlElementContent *p_Var3;
  uint uVar4;
  int iVar5;
  xmlNodePtr pxVar6;
  xmlValidState *pxVar7;
  xmlRegExecCtxtPtr pxVar8;
  xmlParserErrors code;
  uint uVar9;
  ulong uVar10;
  xmlChar *pxVar11;
  xmlRegexpPtr comp;
  char *msg;
  xmlElementContentPtr pxVar12;
  int iVar13;
  int local_4c;
  xmlChar *local_48;
  int extsubset;
  xmlChar *local_38;
  
  extsubset = 0;
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    return 0;
  }
  iVar13 = 1;
  if (((ctxt->vstateNr < 1) || (pxVar7 = ctxt->vstate, pxVar7 == (xmlValidState *)0x0)) ||
     (pxVar2 = pxVar7->elemDecl, pxVar2 == (xmlElementPtr)0x0)) goto switchD_00158306_caseD_2;
  switch(pxVar2->etype) {
  case XML_ELEMENT_TYPE_UNDEFINED:
    iVar13 = 0;
    break;
  case XML_ELEMENT_TYPE_EMPTY:
    pxVar6 = pxVar7->node;
    pxVar11 = pxVar6->name;
    msg = "Element %s was declared EMPTY this one has content\n";
    code = XML_DTD_NOT_EMPTY;
LAB_001583aa:
    qname = (xmlChar *)0x0;
    goto LAB_001585b4;
  case XML_ELEMENT_TYPE_MIXED:
    pxVar12 = pxVar2->content;
    if (pxVar12 == (xmlElementContentPtr)0x0) {
      local_48 = qname;
      xmlSplitQName3(qname,&local_4c);
    }
    else {
      if (pxVar12->type == XML_ELEMENT_CONTENT_PCDATA) {
        pxVar6 = pxVar7->node;
        pxVar11 = pxVar6->name;
        msg = "Element %s was declared #PCDATA but contains non text nodes\n";
        code = XML_DTD_NOT_PCDATA;
        goto LAB_001583aa;
      }
      local_48 = qname;
      local_38 = xmlSplitQName3(qname,&local_4c);
      if (local_38 == (xmlChar *)0x0) {
        do {
          if (pxVar12->type == XML_ELEMENT_CONTENT_OR) {
            p_Var3 = pxVar12->c1;
            if (p_Var3 == (_xmlElementContent *)0x0) break;
            if (p_Var3->type != XML_ELEMENT_CONTENT_PCDATA) {
              if (p_Var3->type != XML_ELEMENT_CONTENT_ELEMENT) break;
              if (p_Var3->prefix == (xmlChar *)0x0) {
                pxVar11 = p_Var3->name;
                goto LAB_00158501;
              }
            }
          }
          else {
            if (pxVar12->type != XML_ELEMENT_CONTENT_ELEMENT) break;
            if (pxVar12->prefix == (xmlChar *)0x0) {
              pxVar11 = pxVar12->name;
LAB_00158501:
              iVar5 = xmlStrEqual(pxVar11,local_48);
              if (iVar5 != 0) goto switchD_00158306_caseD_2;
            }
          }
          pxVar12 = pxVar12->c2;
        } while (pxVar12 != (_xmlElementContent *)0x0);
      }
      else {
        do {
          if (pxVar12->type == XML_ELEMENT_CONTENT_OR) {
            p_Var3 = pxVar12->c1;
            if (p_Var3 == (_xmlElementContent *)0x0) goto LAB_00158550;
            if (p_Var3->type != XML_ELEMENT_CONTENT_PCDATA) {
              if (p_Var3->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_00158550;
              if ((p_Var3->prefix != (xmlChar *)0x0) &&
                 (iVar5 = xmlStrncmp(p_Var3->prefix,local_48,local_4c), iVar5 == 0)) {
                pxVar11 = pxVar12->c1->name;
                goto LAB_00158496;
              }
            }
          }
          else {
            if (pxVar12->type != XML_ELEMENT_CONTENT_ELEMENT) {
LAB_00158550:
              xmlDoErrValid(ctxt,(xmlNodePtr)0x0,XML_DTD_MIXED_CORRUPT,2,(xmlChar *)0x0,
                            (xmlChar *)0x0,(xmlChar *)0x0,0,"Internal: MIXED struct corrupted\n",0);
              break;
            }
            if ((pxVar12->prefix != (xmlChar *)0x0) &&
               (iVar5 = xmlStrncmp(pxVar12->prefix,local_48,local_4c), iVar5 == 0)) {
              pxVar11 = pxVar12->name;
LAB_00158496:
              iVar5 = xmlStrEqual(pxVar11,local_38);
              if (iVar5 == 0) goto LAB_001584a8;
              goto switchD_00158306_caseD_2;
            }
          }
LAB_001584a8:
          pxVar12 = pxVar12->c2;
        } while (pxVar12 != (_xmlElementContent *)0x0);
      }
    }
    pxVar6 = pxVar7->node;
    qname = pxVar6->name;
    msg = "Element %s is not declared in %s list of possible children\n";
    code = XML_DTD_INVALID_CHILD;
    pxVar11 = local_48;
LAB_001585b4:
    iVar13 = 0;
    xmlDoErrValid(ctxt,pxVar6,code,2,pxVar11,qname,(xmlChar *)0x0,0,msg,pxVar11,qname,0);
    break;
  case XML_ELEMENT_TYPE_ELEMENT:
    if (pxVar7->exec != (xmlRegExecCtxtPtr)0x0) {
      iVar5 = xmlRegExecPushString(pxVar7->exec,qname,(void *)0x0);
      if (iVar5 == -5) {
        xmlVErrMemory(ctxt);
        return 0;
      }
      if (iVar5 < 0) {
        pxVar6 = pxVar7->node;
        msg = "Element %s content does not follow the DTD, Misplaced %s\n";
        code = XML_DTD_CONTENT_MODEL;
        pxVar11 = pxVar6->name;
        goto LAB_001585b4;
      }
    }
  }
switchD_00158306_caseD_2:
  pxVar6 = (xmlNodePtr)xmlValidGetElemDecl(ctxt,doc,elem,&extsubset);
  iVar5 = ctxt->vstateNr;
  uVar1 = ctxt->vstateMax;
  if (iVar5 < (int)uVar1) {
    pxVar7 = ctxt->vstateTab;
LAB_00158637:
    pxVar7 = pxVar7 + iVar5;
    ctxt->vstate = pxVar7;
    pxVar7->elemDecl = (xmlElementPtr)pxVar6;
    pxVar7->node = elem;
    if ((pxVar6 != (xmlNodePtr)0x0) && (*(int *)&pxVar6->ns == 4)) {
      comp = (xmlRegexpPtr)pxVar6->psvi;
      if (comp == (xmlRegexpPtr)0x0) {
        xmlValidBuildContentModel(ctxt,(xmlElementPtr)pxVar6);
        comp = (xmlRegexpPtr)pxVar6->psvi;
        if (comp == (xmlRegexpPtr)0x0) {
          ctxt->vstateTab[ctxt->vstateNr].exec = (xmlRegExecCtxtPtr)0x0;
          xmlDoErrValid(ctxt,pxVar6,XML_ERR_INTERNAL_ERROR,2,elem->name,(xmlChar *)0x0,
                        (xmlChar *)0x0,0,"Failed to build content model regexp for %s\n",elem->name,
                        0,0);
          iVar5 = ctxt->vstateNr;
          goto LAB_0015870b;
        }
      }
      pxVar8 = xmlRegNewExecCtxt(comp,(xmlRegExecCallbacks)0x0,(void *)0x0);
      iVar5 = ctxt->vstateNr;
      ctxt->vstateTab[iVar5].exec = pxVar8;
      if (pxVar8 == (xmlRegExecCtxtPtr)0x0) goto LAB_001586a0;
    }
LAB_0015870b:
    ctxt->vstateNr = iVar5 + 1;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar10 = 10;
LAB_00158611:
      pxVar7 = (xmlValidState *)(*xmlRealloc)(ctxt->vstateTab,uVar10 * 0x18);
      if (pxVar7 != (xmlValidState *)0x0) {
        ctxt->vstateTab = pxVar7;
        ctxt->vstateMax = (int)uVar10;
        iVar5 = ctxt->vstateNr;
        goto LAB_00158637;
      }
    }
    else if (uVar1 < 1000000000) {
      uVar9 = uVar1 + 1 >> 1;
      uVar4 = uVar9 + uVar1;
      if (1000000000 - uVar9 < uVar1) {
        uVar4 = 1000000000;
      }
      uVar10 = (ulong)uVar4;
      goto LAB_00158611;
    }
LAB_001586a0:
    xmlVErrMemory(ctxt);
  }
  return iVar13;
}

Assistant:

int
xmlValidatePushElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       xmlNodePtr elem, const xmlChar *qname) {
    int ret = 1;
    xmlElementPtr eDecl;
    int extsubset = 0;

    if (ctxt == NULL)
        return(0);

    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    switch(elemDecl->etype) {
		case XML_ELEMENT_TYPE_UNDEFINED:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_EMPTY:
		    xmlErrValidNode(ctxt, state->node,
				    XML_DTD_NOT_EMPTY,
	       "Element %s was declared EMPTY this one has content\n",
			   state->node->name, NULL, NULL);
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_ANY:
		    /* I don't think anything is required then */
		    break;
		case XML_ELEMENT_TYPE_MIXED:
		    /* simple case of declared as #PCDATA */
		    if ((elemDecl->content != NULL) &&
			(elemDecl->content->type ==
			 XML_ELEMENT_CONTENT_PCDATA)) {
			xmlErrValidNode(ctxt, state->node,
					XML_DTD_NOT_PCDATA,
	       "Element %s was declared #PCDATA but contains non text nodes\n",
				state->node->name, NULL, NULL);
			ret = 0;
		    } else {
			ret = xmlValidateCheckMixed(ctxt, elemDecl->content,
				                    qname);
			if (ret != 1) {
			    xmlErrValidNode(ctxt, state->node,
					    XML_DTD_INVALID_CHILD,
	       "Element %s is not declared in %s list of possible children\n",
				    qname, state->node->name, NULL);
			}
		    }
		    break;
		case XML_ELEMENT_TYPE_ELEMENT:
		    /*
		     * TODO:
		     * VC: Standalone Document Declaration
		     *     - element types with element content, if white space
		     *       occurs directly within any instance of those types.
		     */
		    if (state->exec != NULL) {
			ret = xmlRegExecPushString(state->exec, qname, NULL);
                        if (ret == XML_REGEXP_OUT_OF_MEMORY) {
                            xmlVErrMemory(ctxt);
                            return(0);
                        }
			if (ret < 0) {
			    xmlErrValidNode(ctxt, state->node,
					    XML_DTD_CONTENT_MODEL,
	       "Element %s content does not follow the DTD, Misplaced %s\n",
				   state->node->name, qname, NULL);
			    ret = 0;
			} else {
			    ret = 1;
			}
		    }
		    break;
	    }
	}
    }
    eDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    vstateVPush(ctxt, eDecl, elem);
    return(ret);
}